

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>::DeleteProperty
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *this,
          DynamicObject *instance,JavascriptString *propertyNameString,
          PropertyOperationFlags propertyOperationFlags)

{
  byte bVar1;
  Type *pTVar2;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  RecyclerWeakReference<Js::DynamicObject> *pRVar3;
  code *pcVar4;
  ScriptContext *this_01;
  DynamicObject *pDVar5;
  bool bVar6;
  charcount_t cVar7;
  uint uVar8;
  int iVar9;
  PropertyId propertyId;
  BOOL BVar10;
  char16 *pcVar11;
  undefined4 *puVar12;
  undefined4 extraout_var;
  RecyclableObject *pRVar13;
  SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true> *this_02;
  SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true> *pSVar14;
  byte bVar15;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  CharacterBuffer<char16_t> local_60;
  RecyclableObject *local_50;
  ScriptContext *local_48;
  DynamicObject *local_40;
  PropertyOperationFlags local_34;
  
  local_40 = instance;
  local_34 = propertyOperationFlags;
  while( true ) {
    pcVar11 = JavascriptString::GetString(propertyNameString);
    cVar7 = JavascriptString::GetLength(propertyNameString);
    bVar6 = PropertyRecord::IsPropertyNameNumeric(pcVar11,cVar7);
    if (bVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x617,
                                  "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                  ,
                                  "Numeric property names should have been converted to uint or PropertyRecord* "
                                 );
      if (!bVar6) goto LAB_00dee11d;
      *puVar12 = 0;
    }
    pDVar5 = local_40;
    bVar1 = (((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true> *)this)->
            super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>).
            super_DynamicTypeHandler.flags;
    if ((bVar1 & 4) == 0) break;
    this = ConvertToNonSharedSimpleDictionaryType(this,local_40);
  }
  if ((DAT_015d633c == '\x01') &&
     (((((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true> *)this)->
       super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>).field_0x28 & 6)
      == 0)) {
    pSVar14 = SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true>::
              ConvertToSimpleDictionaryUnorderedTypeHandler<int,Js::JavascriptString*,true>
                        ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true> *)this
                         ,local_40);
    BVar10 = SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>::DeleteProperty
                       (&pSVar14->
                         super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>,
                        pDVar5,propertyNameString,local_34);
    return BVar10;
  }
  pTVar2 = (local_40->super_RecyclableObject).type.ptr;
  if (*(char *)&pTVar2[1].javascriptLibrary.ptr == '\x01') {
    if (((bVar1 & 0x10) != 0) || (*(char *)((long)&pTVar2[1].javascriptLibrary.ptr + 1) == '\x01'))
    {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x627,
                                  "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())",
                                  "!GetIsShared() && !instance->GetDynamicType()->GetIsShared()");
      if (!bVar6) goto LAB_00dee11d;
      *puVar12 = 0;
    }
    DynamicObject::ChangeType(pDVar5);
  }
  local_48 = (((((pDVar5->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr;
  pcVar11 = JavascriptString::GetString(propertyNameString);
  cVar7 = JavascriptString::GetLength(propertyNameString);
  Memory::Recycler::WBSetBit((char *)&local_60);
  local_60.string.ptr = pcVar11;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
  this_00 = (((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true> *)this)->
            super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>).
            propertyMap.ptr;
  local_60.len = cVar7;
  uVar8 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::FindEntryWithKey<JsUtil::CharacterBuffer<char16_t>>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)this_00,&local_60);
  if (-1 < (int)uVar8) {
    descriptor = (SimpleDictionaryPropertyDescriptor<int> *)((this_00->entries).ptr + uVar8);
    bVar1 = descriptor->Attributes;
    if ((bVar1 & 8) != 0) {
      return 1;
    }
    if ((bVar1 & 2) == 0) {
      pcVar11 = JavascriptString::GetString(propertyNameString);
      JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(local_34,local_48,pcVar11);
      return 0;
    }
    if ((bVar1 & 0x10) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x643,"(!(descriptor->Attributes & 0x10))",
                                  "!(descriptor->Attributes & PropertyLetConstGlobal)");
      if (!bVar6) goto LAB_00dee11d;
      *puVar12 = 0;
    }
    if (descriptor->propertyIndex != -1) {
      local_50 = (((local_48->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).undefinedValue.ptr;
      if (local_48 == (ScriptContext *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x199,"(scriptContext)","scriptContext");
        if (!bVar6) goto LAB_00dee11d;
        *puVar12 = 0;
      }
      pDVar5 = local_40;
      iVar9 = DAT_015d6338;
      bVar1 = (((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true> *)this)
              ->super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>).
              field_0x28;
      if ((0 < DAT_015d6338 && (bVar1 & 2) == 0) &&
         (bVar15 = (((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true> *)
                    this)->
                   super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>).
                   numDeletedProperties + 1,
         (((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true> *)this)->
         super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>).
         numDeletedProperties = bVar15, iVar9 <= (int)(uint)bVar15)) {
        if (((bVar1 & 4) == 0) &&
           (pRVar13 = ForInObjectEnumerator::GetFirstPrototypeWithEnumerableProperties
                                (&local_40->super_RecyclableObject,(RecyclableObject **)0x0),
           pRVar13 == (RecyclableObject *)0x0)) {
          bVar6 = Phases::IsEnabled((Phases *)&DAT_015d3490,TypeHandlerTransitionPhase);
          if (bVar6) {
            Output::Print(L"Transitioning to string keyed SimpleDictionaryUnorderedTypeHandler\n");
            Output::Flush();
          }
          pSVar14 = SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true>::
                    ConvertToSimpleDictionaryUnorderedTypeHandler<int,Js::JavascriptString*,true>
                              ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true>
                                *)this,pDVar5);
          BVar10 = SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>::
                   DeleteProperty(&pSVar14->
                                   super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>
                                  ,pDVar5,propertyNameString,local_34);
          return BVar10;
        }
        bVar6 = Phases::IsEnabled((Phases *)&DAT_015d3490,TypeHandlerTransitionPhase);
        if (bVar6) {
          Output::Print(
                       L"Transitioning to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"
                       );
          Output::Flush();
        }
        this_02 = SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true>::
                  ConvertToSimpleDictionaryUnorderedTypeHandler<int,Js::PropertyRecord_const*,true>
                            ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true> *)
                             this,pDVar5);
        BVar10 = DeleteProperty(&this_02->
                                 super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>
                                ,pDVar5,propertyNameString,local_34);
        return BVar10;
      }
      pRVar3 = (((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true> *)this
                )->super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>).
               singletonInstance.ptr;
      if ((pRVar3 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
         ((DynamicObject *)(pRVar3->super_RecyclerWeakReferenceBase).strongRef != local_40)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x66f,
                                    "(this->singletonInstance == nullptr || instance == this->singletonInstance->Get())"
                                    ,
                                    "this->singletonInstance == nullptr || instance == this->singletonInstance->Get()"
                                   );
        if (!bVar6) {
LAB_00dee11d:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar12 = 0;
      }
      SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true>::
      InvalidateFixedField<Js::JavascriptString*>
                ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true> *)this,
                 propertyNameString,descriptor,
                 (((((local_40->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr);
      if (((((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true> *)this)->
           super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>).
           super_DynamicTypeHandler.flags & 0x20) != 0) {
        iVar9 = (*(propertyNameString->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])
                          (propertyNameString);
        cVar7 = JavascriptString::GetLength(propertyNameString);
        this_01 = local_48;
        propertyId = ScriptContext::GetOrAddPropertyIdTracked
                               (local_48,(LPCWSTR)CONCAT44(extraout_var,iVar9),cVar7);
        ScriptContext::InvalidateProtoCaches(this_01,propertyId);
      }
      if ((((((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true> *)this)->
            super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>).field_0x28
           & 2) == 0) ||
         (bVar6 = SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true>::
                  TryRegisterDeletedPropertyIndex
                            ((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true>
                              *)this,local_40,descriptor->propertyIndex), !bVar6)) {
        DynamicTypeHandler::SetSlotUnchecked(local_40,descriptor->propertyIndex,local_50);
      }
    }
    pDVar5 = local_40;
    descriptor->Attributes = '\x0e';
    if ((char)((local_40->super_RecyclableObject).type.ptr)->flags < '\0') {
      DynamicObject::ChangeType(local_40);
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,pDVar5,&local_60,(Var)0x0,SideEffects_Any);
  }
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::DeleteProperty(DynamicObject* instance, JavascriptString* propertyNameString, PropertyOperationFlags propertyOperationFlags)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord* ");

        if (!GetIsLocked())
        {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            if (CONFIG_FLAG(ForceStringKeyedSimpleDictionaryTypeHandler) &&
                !TMapKey_IsJavascriptString<TMapKey>() &&
                !isUnordered && !hasNamelessPropertyId)
            {
                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                    ->DeleteProperty(instance, propertyNameString, propertyOperationFlags);
            }
#endif

            if (instance->GetDynamicType()->GetIsLocked())
            {
                Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                instance->ChangeType();
            }

            ScriptContext* scriptContext = instance->GetScriptContext();

            JsUtil::CharacterBuffer<WCHAR> propertyName(propertyNameString->GetString(), propertyNameString->GetLength());
            SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
            if (propertyMap->TryGetReference(propertyName, &descriptor))
            {
                if (descriptor->Attributes & PropertyDeleted)
                {
                    // If PropertyLetConstGlobal is present then we have a let/const and no global property,
                    // since SimpleDictionaryTypeHandler does not support shadowing which means it can only
                    // have one or the other.  Therefore return true for no property found if allowLetConstGlobal
                    // is false.  If allowLetConstGlobal is true we will enter the else if branch below and
                    // return false since let/const variables cannot be deleted.
                    return true;
                }
                else if (!(descriptor->Attributes & PropertyConfigurable))
                {
                    JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                        propertyOperationFlags, scriptContext, propertyNameString->GetString()); // or propertyName->GetBuffer

                    return false;
                }
                Assert(!(descriptor->Attributes & PropertyLetConstGlobal));
                Var undefined = scriptContext->GetLibrary()->GetUndefined();
                if (descriptor->propertyIndex != NoSlots)
                {
                    if (SupportsSwitchingToUnordered(scriptContext))
                    {
                        ++numDeletedProperties;
                        if (numDeletedProperties >= CONFIG_FLAG(DeletedPropertyReuseThreshold))
                        {
                            // This type handler is being used as a hashtable. Start reusing deleted property indexes for new
                            // property IDs. After this, enumeration order is nondeterministic.
                            // Also use JavascriptString* as the property map key so that PropertyRecords can be avoided
                            // entirely where possible.

                            // Check if prototype chain has enumerable properties, according to logic used in
                            // ForInObjectEnumerator::Initialize().  If there are enumerable properties in the
                            // prototype chain, then enumerating this object's properties will require keeping
                            // track of properties so that shadowed properties are not included, but doing so
                            // currently requires converting the property to a PropertyRecord with a PropertyId
                            // for use in a bit vector that tracks shadowing.  To avoid having a string keyed
                            // type handler hit this, only convert to the string keyed type handler if the
                            // prototype chain does not have enumerable properties.
                            bool fConvertToStringKeyedHandler =
                                !hasNamelessPropertyId &&
                                ForInObjectEnumerator::GetFirstPrototypeWithEnumerableProperties(instance) == nullptr;

                            if (fConvertToStringKeyedHandler)
                            {
                                PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning to string keyed SimpleDictionaryUnorderedTypeHandler\n"));
                                // if TMapKey is already JavascriptString* we will not get here because we'd
                                // already be unordered and SupportsSwitchingToUnordered would have returned false
                                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                                    ->DeleteProperty(instance, propertyNameString, propertyOperationFlags);
                            }
                            else
                            {
                                PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"));
                                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, TMapKey, IsNotExtensibleSupported>(instance)
                                    ->DeleteProperty(instance, propertyNameString, propertyOperationFlags);
                            }
                        }
                    }

#if ENABLE_FIXED_FIELDS
                    Assert(this->singletonInstance == nullptr || instance == this->singletonInstance->Get());
                    InvalidateFixedField(propertyNameString, descriptor, instance->GetScriptContext());
#endif
                    if (this->GetFlags() & IsPrototypeFlag)
                    {
                        scriptContext->InvalidateProtoCaches(scriptContext->GetOrAddPropertyIdTracked(propertyNameString->GetSz(), propertyNameString->GetLength()));
                    }

                    // If this is an unordered type handler, register the deleted property index so that it can be reused for
                    // other property IDs added later
                    if (!isUnordered ||
                        !AsUnordered()->TryRegisterDeletedPropertyIndex(instance, descriptor->propertyIndex))
                    {
                        SetSlotUnchecked(instance, descriptor->propertyIndex, undefined);
                    }
                }
                descriptor->Attributes = PropertyDeletedDefaults;

                // Change the type so as we can invalidate the cache in fast path jit
                if (instance->GetType()->HasBeenCached())
                {
                    instance->ChangeType();
                }
                SetPropertyUpdateSideEffect(instance, propertyName, nullptr, SideEffects_Any);
                return true;
            }
        }
        else
        {
            SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported> *simpleBase = ConvertToNonSharedSimpleDictionaryType(instance);
            return simpleBase->DeleteProperty(instance, propertyNameString, propertyOperationFlags);
        }
        return true;
    }